

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlParserInputBufferCreateFile(FILE *file,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  FILE *file_local;
  
  if (xmlInputCallbackInitialized == 0) {
    xmlRegisterDefaultInputCallbacks();
  }
  if (file == (FILE *)0x0) {
    file_local = (FILE *)0x0;
  }
  else {
    file_local = (FILE *)xmlAllocParserInputBuffer(enc);
    if (file_local != (FILE *)0x0) {
      *(FILE **)file_local = file;
      file_local->_IO_read_ptr = (char *)xmlFileRead;
      file_local->_IO_read_end = (char *)xmlFileFlush;
    }
  }
  return (xmlParserInputBufferPtr)file_local;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFile(FILE *file, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (xmlInputCallbackInitialized == 0)
	xmlRegisterDefaultInputCallbacks();

    if (file == NULL) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = file;
	ret->readcallback = xmlFileRead;
	ret->closecallback = xmlFileFlush;
    }

    return(ret);
}